

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnit.cpp
# Opt level: O0

void __thiscall celero::JUnit::save(JUnit *this)

{
  byte bVar1;
  bool bVar2;
  Impl *pIVar3;
  ostream *poVar4;
  reference ppVar5;
  uint64_t uVar6;
  size_type sVar7;
  reference psVar8;
  element_type *peVar9;
  Experiment *pEVar10;
  int64_t iVar11;
  double dVar12;
  double dVar13;
  uint64_t local_400;
  string local_320;
  undefined1 local_300 [8];
  shared_ptr<celero::ExperimentResult> j_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
  *__range3_1;
  undefined1 local_2d0 [8];
  shared_ptr<celero::ExperimentResult> j;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
  *__range3;
  vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
  runs;
  size_t testSuiteErrors;
  size_t testSuiteFailures;
  uint64_t testSuiteTime;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
  i;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>_>_>
  *__range2;
  ofstream *os;
  string local_210 [8];
  ofstream ofs;
  JUnit *this_local;
  
  std::ofstream::ofstream(local_210);
  pIVar3 = Pimpl<celero::JUnit::Impl>::operator->(&this->pimpl);
  std::ofstream::open(local_210,(_Ios_Openmode)pIVar3);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 1) {
    poVar4 = std::operator<<((ostream *)local_210,"<?xml version=\"1.0\" encoding=\"UTF-8\" ?>");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pIVar3 = Pimpl<celero::JUnit::Impl>::operator->(&this->pimpl);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>_>_>
             ::begin(&pIVar3->results);
    i.second.
    super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>_>_>
                  ::end(&pIVar3->results);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&i.second.
                                                  super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                  ), bVar2) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>_>
               ::operator*(&__end2);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
              *)&testSuiteTime,ppVar5);
      testSuiteFailures = 0;
      testSuiteErrors = 0;
      runs.
      super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
      ::vector((vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                *)&__range3,
               (vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                *)((long)&i.first.field_2 + 8));
      __end3 = std::
               vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
               ::begin((vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                        *)&__range3);
      j.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
           ::end((vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                  *)&__range3);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::shared_ptr<celero::ExperimentResult>_*,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
                                         *)&j.
                                            super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount), bVar2) {
        psVar8 = __gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<celero::ExperimentResult>_*,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
                 ::operator*(&__end3);
        std::shared_ptr<celero::ExperimentResult>::shared_ptr
                  ((shared_ptr<celero::ExperimentResult> *)local_2d0,psVar8);
        peVar9 = std::
                 __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_2d0);
        bVar2 = ExperimentResult::getFailure(peVar9);
        if (bVar2) {
          runs.
          super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&((runs.
                                  super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + 1);
        }
        else {
          peVar9 = std::
                   __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_2d0);
          pEVar10 = ExperimentResult::getExperiment(peVar9);
          dVar12 = Experiment::getBaselineTarget(pEVar10);
          if (0.0 < dVar12) {
            peVar9 = std::
                     __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_2d0);
            dVar12 = ExperimentResult::getBaselineMeasurement(peVar9);
            peVar9 = std::
                     __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_2d0);
            pEVar10 = ExperimentResult::getExperiment(peVar9);
            dVar13 = Experiment::getBaselineTarget(pEVar10);
            if (dVar13 < dVar12) {
              testSuiteErrors = testSuiteErrors + 1;
            }
          }
          peVar9 = std::
                   __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_2d0);
          uVar6 = ExperimentResult::getRunTime(peVar9);
          testSuiteFailures = uVar6 + testSuiteFailures;
        }
        std::shared_ptr<celero::ExperimentResult>::~shared_ptr
                  ((shared_ptr<celero::ExperimentResult> *)local_2d0);
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<celero::ExperimentResult>_*,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
        ::operator++(&__end3);
      }
      poVar4 = std::operator<<((ostream *)local_210,"<testsuite errors=\"");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(ulong)runs.
                                        super__Vector_base<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar4,"\" ");
      poVar4 = std::operator<<((ostream *)local_210,"tests=\"");
      sVar7 = std::
              vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
              ::size((vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                      *)((long)&i.first.field_2 + 8));
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar7);
      std::operator<<(poVar4,"\" ");
      poVar4 = std::operator<<((ostream *)local_210,"time=\"");
      dVar12 = timer::ConvertSystemTime(testSuiteFailures);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar12);
      std::operator<<(poVar4,"\" ");
      poVar4 = std::operator<<((ostream *)local_210,"failures=\"");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,testSuiteErrors);
      std::operator<<(poVar4,"\" ");
      poVar4 = std::operator<<((ostream *)local_210,"name=\"");
      poVar4 = std::operator<<(poVar4,(string *)&testSuiteTime);
      poVar4 = std::operator<<(poVar4,"\">");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      __end3_1 = std::
                 vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                 ::begin((vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                          *)&__range3);
      j_1.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
             ::end((vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                    *)&__range3);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<const_std::shared_ptr<celero::ExperimentResult>_*,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
                                 *)&j_1.
                                    super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount), bVar2) {
        psVar8 = __gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<celero::ExperimentResult>_*,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
                 ::operator*(&__end3_1);
        std::shared_ptr<celero::ExperimentResult>::shared_ptr
                  ((shared_ptr<celero::ExperimentResult> *)local_300,psVar8);
        std::operator<<((ostream *)local_210,"\t<testcase ");
        poVar4 = std::operator<<((ostream *)local_210,"time=\"");
        peVar9 = std::
                 __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_300);
        bVar2 = ExperimentResult::getFailure(peVar9);
        if (bVar2) {
          local_400 = 0;
        }
        else {
          peVar9 = std::
                   __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_300);
          local_400 = ExperimentResult::getRunTime(peVar9);
        }
        dVar12 = timer::ConvertSystemTime(local_400);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar12);
        std::operator<<(poVar4,"\" ");
        poVar4 = std::operator<<((ostream *)local_210,"name=\"");
        peVar9 = std::
                 __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_300);
        pEVar10 = ExperimentResult::getExperiment(peVar9);
        Experiment::getName_abi_cxx11_(&local_320,pEVar10);
        poVar4 = std::operator<<(poVar4,(string *)&local_320);
        poVar4 = std::operator<<(poVar4,"#");
        peVar9 = std::
                 __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_300);
        iVar11 = ExperimentResult::getProblemSpaceValue(peVar9);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar11);
        std::operator<<(poVar4,"\"");
        std::__cxx11::string::~string((string *)&local_320);
        peVar9 = std::
                 __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_300);
        bVar2 = ExperimentResult::getFailure(peVar9);
        if (bVar2) {
          poVar4 = std::operator<<((ostream *)local_210,">");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::operator<<((ostream *)local_210,"\t\t<error ");
          std::operator<<((ostream *)local_210,"type=\"exception\"");
          poVar4 = std::operator<<((ostream *)local_210,"/>");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<((ostream *)local_210,"\t</testcase>");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        else {
          peVar9 = std::
                   __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_300);
          pEVar10 = ExperimentResult::getExperiment(peVar9);
          dVar12 = Experiment::getBaselineTarget(pEVar10);
          if (0.0 < dVar12) {
            peVar9 = std::
                     __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_300);
            dVar12 = ExperimentResult::getBaselineMeasurement(peVar9);
            peVar9 = std::
                     __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_300);
            pEVar10 = ExperimentResult::getExperiment(peVar9);
            dVar13 = Experiment::getBaselineTarget(pEVar10);
            if (dVar13 < dVar12) {
              poVar4 = std::operator<<((ostream *)local_210,">");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              std::operator<<((ostream *)local_210,"\t\t<failure ");
              std::operator<<((ostream *)local_210,"type=\"Performance objective not met.\" ");
              poVar4 = std::operator<<((ostream *)local_210,"message=\"Measurement of ");
              peVar9 = std::
                       __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_300);
              dVar12 = ExperimentResult::getBaselineMeasurement(peVar9);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar12);
              poVar4 = std::operator<<(poVar4," exceeds objective baseline of ");
              peVar9 = std::
                       __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_300);
              pEVar10 = ExperimentResult::getExperiment(peVar9);
              dVar12 = Experiment::getBaselineTarget(pEVar10);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar12);
              std::operator<<(poVar4,"\" ");
              poVar4 = std::operator<<((ostream *)local_210,"/>");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<((ostream *)local_210,"\t</testcase>");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              goto LAB_001a9e49;
            }
          }
          poVar4 = std::operator<<((ostream *)local_210,"/>");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
LAB_001a9e49:
        std::shared_ptr<celero::ExperimentResult>::~shared_ptr
                  ((shared_ptr<celero::ExperimentResult> *)local_300);
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<celero::ExperimentResult>_*,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
        ::operator++(&__end3_1);
      }
      poVar4 = std::operator<<((ostream *)local_210,"</testsuite>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::
      vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
      ::~vector((vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>
                 *)&__range3);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>
               *)&testSuiteTime);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<celero::ExperimentResult>,_std::allocator<std::shared_ptr<celero::ExperimentResult>_>_>_>_>
      ::operator++(&__end2);
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void JUnit::save()
{
	std::ofstream ofs;
	ofs.open(this->pimpl->fileName);

	if(ofs.is_open() == true)
	{
		const auto os = &ofs;

		*os << "<?xml version=\"1.0\" encoding=\"UTF-8\" ?>" << std::endl;

		for(auto i : this->pimpl->results)
		{
			uint64_t testSuiteTime = 0;
			size_t testSuiteFailures = 0;
			size_t testSuiteErrors = 0;

			const auto runs = i.second;

			for(auto j : runs)
			{
				if(j->getFailure())
				{
					testSuiteErrors++;
					continue;
				}
				else if((j->getExperiment()->getBaselineTarget() > 0.0) && (j->getBaselineMeasurement() > j->getExperiment()->getBaselineTarget()))
				{
					testSuiteFailures++;
				}

				testSuiteTime += j->getRunTime();
			}

			*os << "<testsuite errors=\"" << testSuiteErrors << "\" ";
			*os << "tests=\"" << i.second.size() << "\" ";
			*os << "time=\"" << celero::timer::ConvertSystemTime(testSuiteTime) << "\" ";
			*os << "failures=\"" << testSuiteFailures << "\" ";
			*os << "name=\"" << i.first << "\">" << std::endl;

			for(auto j : runs)
			{
				*os << "\t<testcase ";
				*os << "time=\"" << celero::timer::ConvertSystemTime(j->getFailure() ? 0 : j->getRunTime()) << "\" ";
				*os << "name=\"" << j->getExperiment()->getName() << "#" << j->getProblemSpaceValue() << "\"";

				// Compare measured to objective
				if(j->getFailure())
				{
					// Error
					*os << ">" << std::endl;

					*os << "\t\t<error ";
					*os << "type=\"exception\"";
					*os << "/>" << std::endl;

					*os << "\t</testcase>" << std::endl;
				}
				else if((j->getExperiment()->getBaselineTarget() > 0.0) && (j->getBaselineMeasurement() > j->getExperiment()->getBaselineTarget()))
				{
					// Failure
					*os << ">" << std::endl;

					*os << "\t\t<failure ";
					*os << "type=\"Performance objective not met.\" ";
					*os << "message=\"Measurement of " << j->getBaselineMeasurement() << " exceeds objective baseline of "
						<< j->getExperiment()->getBaselineTarget() << "\" ";
					*os << "/>" << std::endl;

					*os << "\t</testcase>" << std::endl;
				}
				else
				{
					// Success
					*os << "/>" << std::endl;
				}
			}

			*os << "</testsuite>" << std::endl;
		}

		ofs.close();
	}
}